

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnLocalSetExpr(BinaryReaderIR *this,Index param_1)

{
  char *__s;
  Offset OVar1;
  Result RVar2;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> tVar3;
  Location loc;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_90;
  Location local_88;
  Var local_68;
  
  local_88.field_1.field_0.line = 0;
  local_88.field_1.field_0.first_column = 0;
  local_88.field_1.field_0.last_column = 0;
  local_88.filename._M_len = 0;
  local_88.filename._M_str._0_4_ = 0;
  local_88.filename._M_str._4_4_ = 0;
  __s = this->filename_;
  local_88.filename._M_len = strlen(__s);
  local_88.filename._M_str._0_4_ = SUB84(__s,0);
  local_88.filename._M_str._4_4_ = (undefined4)((ulong)__s >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_88.field_1.field_0.line = (int)OVar1;
  local_88.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  Var::Var(&local_68,param_1,&local_88);
  tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x88);
  *(long *)((long)tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(undefined4 *)
   ((long)tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 0x19;
  *(undefined ***)
   tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__VarExpr_0016c058;
  Var::Var((Var *)((long)tVar3.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),&local_68);
  local_90._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       tVar3.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_90);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_90._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_90._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  local_90._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)0x0;
  Var::~Var(&local_68);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnLocalSetExpr(Index local_index) {
  return AppendExpr(
      std::make_unique<LocalSetExpr>(Var(local_index, GetLocation())));
}